

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  uint uVar2;
  uint uVar3;
  Message *pMVar4;
  undefined7 in_register_00000011;
  size_t sVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  String SVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  String local_28;
  
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) == 0) {
    uVar2 = Int32FromEnvOrDie(total_shards_env,-1);
    uVar3 = Int32FromEnvOrDie(shard_index_env,-1);
    if ((uVar3 & uVar2) != 0xffffffff) {
      if (uVar3 == 0xffffffff || uVar2 != 0xffffffff) {
        if (uVar2 == 0xffffffff || uVar3 != 0xffffffff) {
          if ((-1 < (int)uVar3) && ((int)uVar3 < (int)uVar2)) {
            return 1 < (int)uVar2;
          }
          Message::Message((Message *)&local_28);
          pMVar4 = Message::operator<<((Message *)&local_28,
                                       (char (*) [48])
                                       "Invalid environment variables: we require 0 <= ");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [18])"GTEST_SHARD_INDEX");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [4])" < ");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [19])"GTEST_TOTAL_SHARDS");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [16])", but you have ");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [18])"GTEST_SHARD_INDEX");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x144083);
          pbVar1 = (pMVar4->ss_).ptr_;
          pbVar6 = pbVar1 + 0x10;
          if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
            pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          std::ostream::operator<<((ostream *)pbVar6,uVar3);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [3])0x1444ce);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [19])"GTEST_TOTAL_SHARDS");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x144083);
          pbVar1 = (pMVar4->ss_).ptr_;
          pbVar6 = pbVar1 + 0x10;
          if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
            pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          std::ostream::operator<<((ostream *)pbVar6,uVar2);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [3])0x142fa8);
          Message::Message((Message *)&local_30,pMVar4);
          if ((long *)local_28.c_str_ != (long *)0x0) {
            (**(code **)(*(long *)local_28.c_str_ + 8))();
          }
          SVar7 = StringStreamToString((internal *)&local_28,local_30.ptr_);
          sVar5 = SVar7.length_;
        }
        else {
          Message::Message((Message *)&local_28);
          pMVar4 = Message::operator<<((Message *)&local_28,
                                       (char (*) [41])"Invalid environment variables: you have ");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [19])"GTEST_TOTAL_SHARDS");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [4])" = ");
          pbVar1 = (pMVar4->ss_).ptr_;
          pbVar6 = pbVar1 + 0x10;
          if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
            pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          std::ostream::operator<<((ostream *)pbVar6,uVar2);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [17])", but have left ");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [18])"GTEST_SHARD_INDEX");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [9])" unset.\n");
          Message::Message((Message *)&local_30,pMVar4);
          if ((long *)local_28.c_str_ != (long *)0x0) {
            (**(code **)(*(long *)local_28.c_str_ + 8))();
          }
          SVar7 = StringStreamToString((internal *)&local_28,local_30.ptr_);
          sVar5 = SVar7.length_;
        }
      }
      else {
        Message::Message((Message *)&local_28);
        pMVar4 = Message::operator<<((Message *)&local_28,
                                     (char (*) [41])"Invalid environment variables: you have ");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [4])" = ");
        pbVar1 = (pMVar4->ss_).ptr_;
        pbVar6 = pbVar1 + 0x10;
        if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        std::ostream::operator<<((ostream *)pbVar6,uVar3);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [17])", but have left ");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [9])" unset.\n");
        Message::Message((Message *)&local_30,pMVar4);
        if ((long *)local_28.c_str_ != (long *)0x0) {
          (**(code **)(*(long *)local_28.c_str_ + 8))();
        }
        SVar7 = StringStreamToString((internal *)&local_28,local_30.ptr_);
        sVar5 = SVar7.length_;
      }
      ColoredPrintf(COLOR_RED,local_28.c_str_,sVar5);
      String::~String(&local_28);
      fflush(_stdout);
      exit(1);
    }
  }
  return false;
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}